

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O2

void ValueArgumentExtracterStream(string *argument,int value_start_position,double *value)

{
  double a;
  string temp_argument;
  exception e;
  
  std::__cxx11::string::substr((ulong)&temp_argument,(ulong)argument);
  std::__cxx11::stringstream::stringstream((stringstream *)&e,(string *)&temp_argument,_S_out|_S_in)
  ;
  std::istream::_M_extract<double>((double *)&e);
  *value = a;
  std::__cxx11::stringstream::~stringstream((stringstream *)&e);
  std::__cxx11::string::~string((string *)&temp_argument);
  return;
}

Assistant:

void ValueArgumentExtracterStream(const string &argument, int value_start_position, double &value)
{
  try{
    string temp_argument = argument.substr(value_start_position, argument.length() - value_start_position);
    stringstream temp_stream(temp_argument);
    double a;
    temp_stream >> a;
    value = a;
  }
  catch (exception e)
  {
    return;
  }
}